

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFontAtlas::ClearFonts(ImFontAtlas *this)

{
  ImFont *this_00;
  ImFont **ptr;
  int iVar1;
  long lVar2;
  
  if (this->Locked == false) {
    iVar1 = (this->Fonts).Size;
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        this_00 = (this->Fonts).Data[lVar2];
        if (this_00 != (ImFont *)0x0) {
          ImFont::~ImFont(this_00);
          ImGui::MemFree(this_00);
          iVar1 = (this->Fonts).Size;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < iVar1);
    }
    ptr = (this->Fonts).Data;
    if (ptr != (ImFont **)0x0) {
      (this->Fonts).Size = 0;
      (this->Fonts).Capacity = 0;
      ImGui::MemFree(ptr);
      (this->Fonts).Data = (ImFont **)0x0;
    }
    return;
  }
  __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                ,0x7d8,"void ImFontAtlas::ClearFonts()");
}

Assistant:

void    ImFontAtlas::ClearFonts()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    for (int i = 0; i < Fonts.Size; i++)
        IM_DELETE(Fonts[i]);
    Fonts.clear();
}